

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_modelWithComponentVariableUnits_Test::TestBody
          (Clone_modelWithComponentVariableUnits_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  shared_ptr<libcellml::Units> *in_R9;
  AssertHelper local_3c8 [8];
  Message local_3c0 [8];
  shared_ptr<libcellml::Component> local_3b8;
  shared_ptr<libcellml::Variable> local_3a8;
  shared_ptr<libcellml::Units> local_398;
  shared_ptr<libcellml::Units> local_388;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_5;
  Message local_360 [8];
  shared_ptr<libcellml::Component> local_358;
  shared_ptr<libcellml::Variable> local_348;
  shared_ptr<libcellml::Units> local_338;
  shared_ptr<libcellml::Units> local_328;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_4;
  Message local_300 [8];
  shared_ptr<libcellml::Component> local_2f8;
  shared_ptr<libcellml::Variable> local_2e8;
  shared_ptr<libcellml::Units> local_2d8;
  shared_ptr<libcellml::Component> local_2c8;
  shared_ptr<libcellml::Variable> local_2b8;
  shared_ptr<libcellml::Units> local_2a8;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_3;
  ModelPtr clonedModel;
  Message local_270 [8];
  shared_ptr<libcellml::Component> local_268;
  shared_ptr<libcellml::Variable> local_258;
  shared_ptr<libcellml::Units> local_248;
  shared_ptr<libcellml::Units> local_238;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_2;
  Message local_210 [8];
  shared_ptr<libcellml::Component> local_208;
  shared_ptr<libcellml::Variable> local_1f8;
  shared_ptr<libcellml::Units> local_1e8;
  shared_ptr<libcellml::Units> local_1d8;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0 [8];
  shared_ptr<libcellml::Component> local_1a8;
  shared_ptr<libcellml::Variable> local_198;
  shared_ptr<libcellml::Units> local_188;
  shared_ptr<libcellml::Component> local_178;
  shared_ptr<libcellml::Variable> local_168;
  shared_ptr<libcellml::Units> local_158;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  string local_130 [32];
  undefined1 local_110 [8];
  VariablePtr v2;
  string local_f8 [32];
  undefined1 local_d8 [8];
  VariablePtr v1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ComponentPtr component;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr units;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Clone_modelWithComponentVariableUnits_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"units",
             (allocator<char> *)
             ((long)&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"component",
             (allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"v1",
             (allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Variable::create((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"v2",(allocator<char> *)&gtest_ar.field_0xf);
  libcellml::Variable::create((string *)local_110);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&gtest_ar.field_0xf);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  libcellml::Model::addUnits((shared_ptr *)peVar2);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar3 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  libcellml::Component::addVariable((shared_ptr *)peVar3);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_d8);
  libcellml::Variable::setUnits((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_110);
  libcellml::Variable::setUnits((shared_ptr *)peVar4);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::ComponentEntity::component((ulong)&local_178);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_178);
  libcellml::Component::variable((ulong)&local_168);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_168);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::ComponentEntity::component((ulong)&local_1a8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1a8);
  libcellml::Component::variable((ulong)&local_198);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_198);
  libcellml::Variable::units();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_148,
             (EqHelper<false> *)"model->component(0)->variable(0)->units()",
             "model->component(0)->variable(1)->units()",(char *)&local_158,&local_188,in_R9);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_188);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_198);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1a8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_158);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_168);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_1b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x210,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Model::units((ulong)&local_1d8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::ComponentEntity::component((ulong)&local_208);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_208);
  libcellml::Component::variable((ulong)&local_1f8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1f8);
  libcellml::Variable::units();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_1c8,(EqHelper<false> *)"model->units(0)",
             "model->component(0)->variable(0)->units()",(char *)&local_1d8,&local_1e8,in_R9);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1e8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1f8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_208);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x211,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Model::units((ulong)&local_238);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::ComponentEntity::component((ulong)&local_268);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_268);
  libcellml::Component::variable((ulong)&local_258);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_258);
  libcellml::Variable::units();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_228,(EqHelper<false> *)"model->units(0)",
             "model->component(0)->variable(1)->units()",(char *)&local_238,&local_248,in_R9);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_248);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_258);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_268);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(local_270);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x212,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_270);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &clonedModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_20);
  libcellml::Model::clone();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::ComponentEntity::component((ulong)&local_2c8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2c8);
  libcellml::Component::variable((ulong)&local_2b8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2b8);
  libcellml::Variable::units();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::ComponentEntity::component((ulong)&local_2f8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2f8);
  libcellml::Component::variable((ulong)&local_2e8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2e8);
  libcellml::Variable::units();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_298,
             (EqHelper<false> *)"clonedModel->component(0)->variable(0)->units()",
             "clonedModel->component(0)->variable(1)->units()",(char *)&local_2a8,&local_2d8,in_R9);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_2d8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_2e8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2f8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_2a8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_2b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(local_300);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x216,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::Model::units((ulong)&local_328);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::ComponentEntity::component((ulong)&local_358);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_358);
  libcellml::Component::variable((ulong)&local_348);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_348);
  libcellml::Variable::units();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_318,(EqHelper<false> *)"clonedModel->units(0)",
             "clonedModel->component(0)->variable(0)->units()",(char *)&local_328,&local_338,in_R9);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_338);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_348);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_358);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(local_360);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x217,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::Model::units((ulong)&local_388);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar_3.message_);
  libcellml::ComponentEntity::component((ulong)&local_3b8);
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3b8);
  libcellml::Component::variable((ulong)&local_3a8);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_3a8);
  libcellml::Variable::units();
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Units>,std::shared_ptr<libcellml::Units>>
            ((AssertionResult *)local_378,(EqHelper<false> *)"clonedModel->units(0)",
             "clonedModel->component(0)->variable(1)->units()",(char *)&local_388,&local_398,in_R9);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_398);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_3a8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_3b8);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(local_3c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              (local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x218,pcVar5);
    testing::internal::AssertHelper::operator=(local_3c8,local_3c0);
    testing::internal::AssertHelper::~AssertHelper(local_3c8);
    testing::Message::~Message(local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_3.message_);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_110);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_a0);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Clone, modelWithComponentVariableUnits)
{
    auto model = libcellml::Model::create("model");
    auto units = libcellml::Units::create("units");
    auto component = libcellml::Component::create("component");
    auto v1 = libcellml::Variable::create("v1");
    auto v2 = libcellml::Variable::create("v2");

    model->addComponent(component);
    model->addUnits(units);
    component->addVariable(v1);
    component->addVariable(v2);
    v1->setUnits(units);
    v2->setUnits(units);

    EXPECT_EQ(model->component(0)->variable(0)->units(), model->component(0)->variable(1)->units());
    EXPECT_EQ(model->units(0), model->component(0)->variable(0)->units());
    EXPECT_EQ(model->units(0), model->component(0)->variable(1)->units());

    auto clonedModel = model->clone();

    EXPECT_EQ(clonedModel->component(0)->variable(0)->units(), clonedModel->component(0)->variable(1)->units());
    EXPECT_EQ(clonedModel->units(0), clonedModel->component(0)->variable(0)->units());
    EXPECT_EQ(clonedModel->units(0), clonedModel->component(0)->variable(1)->units());
}